

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar2
  ;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  uint uVar5;
  double *pdVar6;
  uint uVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar8;
  ulong uVar9;
  value_type vVar10;
  
  pFVar8 = (fadexpr->fadexpr_).left_;
  pFVar2 = (fadexpr->fadexpr_).right_;
  uVar5 = (((((pFVar8->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  uVar1 = (((pFVar2->fadexpr_).left_)->dx_).num_elts;
  uVar7 = (((((pFVar2->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar1) {
    uVar7 = uVar1;
  }
  if ((int)uVar7 < (int)uVar5) {
    uVar7 = uVar5;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar7 == uVar1) {
    if (uVar7 == 0) goto LAB_00f47d17;
    pdVar6 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar7 == 0) {
      if (uVar1 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f47d17;
    }
    if (uVar1 != 0) {
      pdVar6 = (this->dx_).ptr_to_data;
      if (pdVar6 != (double *)0x0) {
        operator_delete__(pdVar6);
        pFVar8 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar7;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar7) {
      uVar9 = (ulong)uVar7 << 3;
    }
    pdVar6 = (double *)operator_new__(uVar9);
    (this->dx_).ptr_to_data = pdVar6;
    uVar5 = (((((pFVar8->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  }
  if (((uVar5 == 0) ||
      (pFVar2 = (fadexpr->fadexpr_).right_, (((pFVar2->fadexpr_).left_)->dx_).num_elts == 0)) ||
     ((((((pFVar2->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar7) {
      uVar9 = 0;
      do {
        vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar9);
        pdVar6[uVar9] = vVar10;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  else if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
               ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar9);
      pdVar6[uVar9] = vVar10;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
LAB_00f47d17:
  pFVar8 = (fadexpr->fadexpr_).left_;
  pFVar2 = (fadexpr->fadexpr_).right_;
  pFVar3 = (pFVar8->fadexpr_).right_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  this->val_ = ((pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_ +
               ((pFVar2->fadexpr_).left_)->val_) *
               ((pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_) *
               (pFVar8->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}